

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QSpanCollection::updateInsertedColumns(QSpanCollection *this,int start,int end)

{
  _Base_ptr *this_00;
  size_t sVar1;
  iterator __begin1;
  QSpanCollection *pQVar2;
  iterator iVar3;
  iterator iVar4;
  iterator it;
  iterator iVar5;
  int iVar6;
  iterator __end1;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QSpanCollection *)
           (this->spans).
           super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (pQVar2 != this) {
    iVar6 = (end - start) + 1;
    for (; pQVar2 != this;
        pQVar2 = (QSpanCollection *)
                 (pQVar2->spans).
                 super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next) {
      sVar1 = (pQVar2->spans).
              super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
              _M_impl._M_node._M_size;
      if (start <= *(int *)(sVar1 + 0xc)) {
        if (start <= *(int *)(sVar1 + 4)) {
          *(int *)(sVar1 + 4) = *(int *)(sVar1 + 4) + iVar6;
        }
        *(int *)(sVar1 + 0xc) = *(int *)(sVar1 + 0xc) + iVar6;
      }
    }
    iVar3._M_node = (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin(&this->index);
    while( true ) {
      iVar4 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end(&this->index);
      if ((iterator)iVar3._M_node == iVar4.i._M_node) break;
      this_00 = &iVar3._M_node[1]._M_parent;
      it._M_node = (_Base_ptr)
                   QMap<int,_QSpanCollection::Span_*>::begin
                             ((QMap<int,_QSpanCollection::Span_*> *)this_00);
      while( true ) {
        iVar5 = QMap<int,_QSpanCollection::Span_*>::end
                          ((QMap<int,_QSpanCollection::Span_*> *)this_00);
        if ((iterator)it._M_node == iVar5.i._M_node) break;
        if ((int)-it._M_node[1]._M_color < start) {
          it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node);
        }
        else {
          local_3c = it._M_node[1]._M_color - iVar6;
          QMap<int,_QSpanCollection::Span_*>::insert
                    ((QMap<int,_QSpanCollection::Span_*> *)this_00,&local_3c,
                     (Span **)&it._M_node[1]._M_parent);
          it._M_node = (_Base_ptr)
                       QMap<int,_QSpanCollection::Span_*>::erase
                                 ((QMap<int,_QSpanCollection::Span_*> *)this_00,it._M_node);
        }
      }
      iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateInsertedColumns(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (Span *span : spans) {
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_right < start)
            continue;
        if (span->m_left >= start)
            span->m_left += delta;
        span->m_right += delta;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ++it_y) {
        SubIndex &subindex = it_y.value();
        for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ) {
            int x = -it.key();
            if (x < start) {
                ++it;
                continue;
            }
            subindex.insert(-x - delta, it.value());
            it = subindex.erase(it);
        }
    }
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
#endif
}